

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ForVariableDeclarationSyntax::ForVariableDeclarationSyntax
          (ForVariableDeclarationSyntax *this,Token varKeyword,DataTypeSyntax *type,
          DeclaratorSyntax *declarator)

{
  DeclaratorSyntax *pDVar1;
  DeclaratorSyntax *local_38;
  DeclaratorSyntax *local_30;
  DeclaratorSyntax *declarator_local;
  DataTypeSyntax *type_local;
  ForVariableDeclarationSyntax *this_local;
  Token varKeyword_local;
  
  varKeyword_local._0_8_ = varKeyword.info;
  this_local = varKeyword._0_8_;
  local_30 = declarator;
  declarator_local = (DeclaratorSyntax *)type;
  type_local = (DataTypeSyntax *)this;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,ForVariableDeclaration);
  *(ForVariableDeclarationSyntax **)&this->varKeyword = this_local;
  (this->varKeyword).info = (Info *)varKeyword_local._0_8_;
  this->type = (DataTypeSyntax *)declarator_local;
  local_38 = local_30;
  not_null<slang::syntax::DeclaratorSyntax*>::not_null<slang::syntax::DeclaratorSyntax*,void>
            ((not_null<slang::syntax::DeclaratorSyntax*> *)&this->declarator,&local_38);
  if (this->type != (DataTypeSyntax *)0x0) {
    (this->type->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  }
  pDVar1 = not_null<slang::syntax::DeclaratorSyntax_*>::operator->(&this->declarator);
  (pDVar1->super_SyntaxNode).parent = &this->super_SyntaxNode;
  return;
}

Assistant:

ForVariableDeclarationSyntax(Token varKeyword, DataTypeSyntax* type, DeclaratorSyntax& declarator) :
        SyntaxNode(SyntaxKind::ForVariableDeclaration), varKeyword(varKeyword), type(type), declarator(&declarator) {
        if (this->type) this->type->parent = this;
        this->declarator->parent = this;
    }